

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_retention.pb.cc
# Opt level: O1

void proto2_unittest::TopLevelMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Nonnull<const_char_*> pcVar4;
  
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    *(undefined4 *)&to_msg[3]._vptr_MessageLite = *(undefined4 *)&from_msg[3]._vptr_MessageLite;
  }
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
  iVar2 = *(int *)&from_msg[4]._vptr_MessageLite;
  if (iVar2 != 0) {
    if (*(int *)&to_msg[4]._vptr_MessageLite != iVar2) {
      if (*(int *)&to_msg[4]._vptr_MessageLite != 0) {
        *(undefined4 *)&to_msg[4]._vptr_MessageLite = 0;
      }
      *(int *)&to_msg[4]._vptr_MessageLite = iVar2;
    }
    if (iVar2 == 2) {
      to_msg[3]._internal_metadata_.ptr_ = from_msg[3]._internal_metadata_.ptr_;
    }
  }
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TopLevelMessage_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TopLevelMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TopLevelMessage*>(&to_msg);
  auto& from = static_cast<const TopLevelMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TopLevelMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_impl_.f_ = from._impl_.f_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_o();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kI: {
        _this->_impl_.o_.i_ = from._impl_.o_.i_;
        break;
      }
      case O_NOT_SET:
        break;
    }
  }
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}